

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::FunctionBreakpoint>::destruct
          (BasicTypeInfo<dap::FunctionBreakpoint> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0x50) != (long *)((long)ptr + 0x60)) {
    operator_delete(*(long **)((long)ptr + 0x50),*(long *)((long)ptr + 0x60) + 1);
  }
  if (*(long **)((long)ptr + 0x28) != (long *)((long)ptr + 0x38)) {
    operator_delete(*(long **)((long)ptr + 0x28),*(long *)((long)ptr + 0x38) + 1);
  }
  if (*ptr != (long *)((long)ptr + 0x10)) {
    operator_delete(*ptr,*(long *)((long)ptr + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }